

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O1

void __thiscall
ki::dml::Field<unsigned_short>::from_xml(Field<unsigned_short> *this,xml_node<char> *node)

{
  int iVar1;
  xml_node<char> *pxVar2;
  ostream *poVar3;
  value_error *pvVar4;
  xml_node<char> *pxVar5;
  long lVar6;
  long *plVar7;
  char *pcVar8;
  char *pcVar9;
  string name;
  string value_2;
  string value;
  long *local_250;
  long local_248;
  long local_240 [2];
  long *local_230;
  long local_228;
  long local_220 [2];
  xml_node<char> *local_210;
  string local_208;
  string local_1e8;
  string local_1c8;
  long *local_1a8;
  long local_1a0;
  long local_198 [45];
  
  pcVar9 = (node->super_xml_base<char>).m_name;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  pcVar8 = (char *)(this->super_FieldBase).m_name._M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)&(this->super_FieldBase).m_name,0,pcVar8,(ulong)pcVar9);
  (this->super_FieldBase).m_transferable = true;
  local_210 = node;
  if ((xml_node<char> *)node->m_first_attribute != (xml_node<char> *)0x0) {
    pxVar5 = (xml_node<char> *)node->m_first_attribute;
    do {
      pcVar9 = (pxVar5->super_xml_base<char>).m_name;
      if (pcVar9 == (char *)0x0) {
        pcVar9 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      std::__cxx11::string::string((string *)&local_250,pcVar9,(allocator *)&local_1a8);
      iVar1 = std::__cxx11::string::compare((char *)&local_250);
      if (iVar1 == 0) {
        pcVar9 = (pxVar5->super_xml_base<char>).m_value;
        if (pcVar9 == (char *)0x0) {
          pcVar9 = &rapidxml::xml_base<char>::nullstr()::zero;
        }
        std::__cxx11::string::string((string *)&local_230,pcVar9,(allocator *)&local_1a8);
        get_type_name(this);
        iVar1 = std::__cxx11::string::compare((char *)&local_230);
        if (iVar1 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"XML Field node has incorrect TYPE attribute value. ",
                     0x33);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"(value=\"",8);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1a8,(char *)local_230,local_228);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\", expected=\"",0xd);
          pcVar9 = get_type_name(this);
          poVar3 = std::operator<<(poVar3,pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\". ",3);
          pvVar4 = (value_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          value_error::value_error(pvVar4,&local_1c8);
          __cxa_throw(pvVar4,&value_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar6 = local_220[0];
        plVar7 = local_230;
        if (local_230 != local_220) goto LAB_0012a0fe;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_250);
        if (iVar1 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"XML Field node has unknown attribute \"",0x26);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1a8,(char *)local_250,local_248);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\".",2);
          pvVar4 = (value_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          value_error::value_error(pvVar4,&local_1e8);
          __cxa_throw(pvVar4,&value_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pcVar9 = (pxVar5->super_xml_base<char>).m_value;
        if (pcVar9 == (char *)0x0) {
          pcVar9 = &rapidxml::xml_base<char>::nullstr()::zero;
        }
        std::__cxx11::string::string((string *)&local_1a8,pcVar9,(allocator *)&local_230);
        iVar1 = std::__cxx11::string::compare((char *)&local_1a8);
        (this->super_FieldBase).m_transferable = iVar1 != 0;
        lVar6 = local_198[0];
        plVar7 = local_1a8;
        if (local_1a8 != local_198) {
LAB_0012a0fe:
          operator_delete(plVar7,lVar6 + 1);
        }
      }
      if (local_250 != local_240) {
        operator_delete(local_250,local_240[0] + 1);
      }
      pxVar2 = (pxVar5->super_xml_base<char>).m_parent;
      if (pxVar2 != (xml_node<char> *)0x0) {
        pxVar2 = pxVar5->m_first_node;
      }
      pxVar5 = pxVar2;
    } while (pxVar2 != (xml_node<char> *)0x0);
  }
  pcVar9 = (local_210->super_xml_base<char>).m_value;
  pcVar8 = &rapidxml::xml_base<char>::nullstr()::zero;
  if (pcVar9 != (char *)0x0) {
    pcVar8 = pcVar9;
  }
  std::__cxx11::string::string((string *)&local_1a8,pcVar8,(allocator *)&local_250);
  if (local_1a0 != 0) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_1a8,(long)local_1a8 + local_1a0);
    set_value_from_string(this,&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  return;
}

Assistant:

void from_xml(const rapidxml::xml_node<> *node) final
		{
			// Use the name of the node as the field name and,
			// default transferable to TRUE.
			m_name = node->name();
			m_transferable = true;

			for (auto *attr = node->first_attribute();
				attr; attr = attr->next_attribute())
			{
				const std::string name = attr->name();
				if (name == "TYPE")
				{
					const std::string value = attr->value();
					if (value != get_type_name())
					{
						std::ostringstream oss;
						oss << "XML Field node has incorrect TYPE attribute value. ";
						oss << "(value=\"" << value << "\", expected=\"" << get_type_name() << "\". ";
						throw value_error(oss.str());
					}
				}
				else if (name == "NOXFER")
				{
					const std::string value = attr->value();
					m_transferable = value != "TRUE";
				}
				else
				{
					std::ostringstream oss;
					oss << "XML Field node has unknown attribute \"" << name << "\".";
					throw value_error(oss.str());
				}
			}

			const std::string value = node->value();
			if (!value.empty())
				set_value_from_string(value);
		}